

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall
mkvmuxer::Segment::CopyAndMoveCuesBeforeClusters
          (Segment *this,IMkvReader *reader,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  
  iVar2 = (*writer->_vptr_IMkvWriter[3])(writer);
  if (((char)iVar2 != '\0') && (this->chunking_ == false)) {
    lVar6 = (*this->cluster_list_)->size_position_;
    iVar3 = GetUIntSize(0x1f43b675);
    lVar6 = lVar6 - iVar3;
    bVar1 = ChunkedCopy(reader,writer,0,lVar6);
    if (!bVar1) {
      return false;
    }
    MoveCuesBeforeClusters(this);
    bVar1 = Cues::Write(&this->cues_,writer);
    if (((bVar1) && (bVar1 = SeekHead::Finalize(&this->seek_head_,writer), bVar1)) &&
       (bVar1 = ChunkedCopy(reader,writer,lVar6,this->cluster_end_offset_ - lVar6), bVar1)) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      iVar4 = (*writer->_vptr_IMkvWriter[1])(writer);
      lVar6 = this->payload_pos_;
      iVar5 = (*writer->_vptr_IMkvWriter[2])(writer,this->size_position_);
      if ((iVar5 == 0) &&
         (iVar3 = WriteUIntSize(writer,CONCAT44(extraout_var_00,iVar4) - lVar6,8), iVar3 == 0)) {
        iVar2 = (*writer->_vptr_IMkvWriter[2])(writer,CONCAT44(extraout_var,iVar2));
        return iVar2 == 0;
      }
    }
  }
  return false;
}

Assistant:

bool Segment::CopyAndMoveCuesBeforeClusters(mkvparser::IMkvReader* reader,
                                            IMkvWriter* writer) {
  if (!writer->Seekable() || chunking_)
    return false;
  const int64_t cluster_offset =
      cluster_list_[0]->size_position() - GetUIntSize(libwebm::kMkvCluster);

  // Copy the headers.
  if (!ChunkedCopy(reader, writer, 0, cluster_offset))
    return false;

  // Recompute cue positions and seek entries.
  MoveCuesBeforeClusters();

  // Write cues and seek entries.
  // TODO(vigneshv): As of now, it's safe to call seek_head_.Finalize() for the
  // second time with a different writer object. But the name Finalize() doesn't
  // indicate something we want to call more than once. So consider renaming it
  // to write() or some such.
  if (!cues_.Write(writer) || !seek_head_.Finalize(writer))
    return false;

  // Copy the Clusters.
  if (!ChunkedCopy(reader, writer, cluster_offset,
                   cluster_end_offset_ - cluster_offset))
    return false;

  // Update the Segment size in case the Cues size has changed.
  const int64_t pos = writer->Position();
  const int64_t segment_size = writer->Position() - payload_pos_;
  if (writer->Position(size_position_) ||
      WriteUIntSize(writer, segment_size, 8) || writer->Position(pos))
    return false;
  return true;
}